

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)23,_(unsigned_short)0>::Pack
               (uint64_t *in,uint32_t *out)

{
  *out = (uint)*in & 0x7fffff;
  Unroller<(unsigned_short)23,_(unsigned_short)1>::Pack(in,out);
  return;
}

Assistant:

static void Pack(const uint64_t *__restrict in, uint32_t *__restrict out) {
		pack_single_in64<DELTA, (DELTA * OINDEX) % 32, (1ULL << DELTA) - 1>(in[OINDEX], out);

		Unroller<DELTA, OINDEX + 1>::Pack(in, out);
	}